

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O3

void __thiscall avro::StreamReader::readBytes(StreamReader *this,uint8_t *b,size_t n)

{
  uint8_t *__src;
  uint8_t *puVar1;
  ulong __n;
  
  if (n != 0) {
    __src = this->next_;
    do {
      puVar1 = this->end_;
      if (__src == puVar1) {
        more(this);
        __src = this->next_;
        puVar1 = this->end_;
      }
      __n = (long)puVar1 - (long)__src;
      if (n <= (ulong)((long)puVar1 - (long)__src)) {
        __n = n;
      }
      memcpy(b,__src,__n);
      __src = this->next_ + __n;
      this->next_ = __src;
      b = b + __n;
      n = n - __n;
    } while (n != 0);
  }
  return;
}

Assistant:

void readBytes(uint8_t* b, size_t n) {
        while (n > 0) {
            if (next_ == end_) {
                more();
            }
            size_t q = end_ - next_;
            if (q > n) {
                q = n;
            }
            ::memcpy(b, next_, q);
            next_ += q;
            b += q;
            n -= q;
        }
    }